

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

string * __thiscall
iutest::internal::FormatForComparisonFailureMessage<double,double>
          (string *__return_storage_ptr__,internal *this,double *value,double *param_2)

{
  double *param_1_local;
  double *value_local;
  
  PrintToString<double>(__return_storage_ptr__,(double *)this);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string FormatForComparisonFailureMessage(const T1& value, const T2& /*other_operand*/)
{
    return PrintToString(value);
}